

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmLocalNinjaGenerator::WritePools(cmLocalNinjaGenerator *this,ostream *os)

{
  cmState *this_00;
  int iVar1;
  char *pcVar2;
  long lVar3;
  ostream *poVar4;
  size_t i;
  ulong uVar5;
  long *plVar6;
  long lVar7;
  uint jobs;
  ostream *local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pools;
  
  local_70 = os;
  cmGlobalNinjaGenerator::WriteDivider(os);
  this_00 = ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            CMakeInstance->State;
  std::__cxx11::string::string((string *)&local_68,"JOB_POOLS",(allocator *)&pools);
  pcVar2 = cmState::GetGlobalProperty(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_68,"Pools defined by global property JOB_POOLS",(allocator *)&pools)
    ;
    cmGlobalNinjaGenerator::WriteComment(local_70,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    pools.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pools.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pools.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_68,pcVar2,(allocator *)&jobs);
    cmSystemTools::ExpandListArgument(&local_68,&pools,false);
    std::__cxx11::string::~string((string *)&local_68);
    lVar7 = 0;
    for (uVar5 = 0;
        uVar5 < (ulong)((long)pools.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)pools.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
      plVar6 = (long *)((long)&((pools.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar7);
      lVar3 = std::__cxx11::string::find((char)plVar6,0x3d);
      if (lVar3 == -1) {
LAB_0034961e:
        cmSystemTools::Error
                  ("Invalid pool defined by property \'JOB_POOLS\': ",(char *)*plVar6,(char *)0x0,
                   (char *)0x0);
      }
      else {
        iVar1 = __isoc99_sscanf(*plVar6 + lVar3,"=%u",&jobs);
        if (iVar1 != 1) goto LAB_0034961e;
        poVar4 = std::operator<<(local_70,"pool ");
        std::__cxx11::string::substr((ulong)&local_68,(ulong)plVar6);
        poVar4 = std::operator<<(poVar4,(string *)&local_68);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&local_68);
        poVar4 = std::operator<<(local_70,"  depth = ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::endl<char,std::char_traits<char>>(local_70);
      }
      lVar7 = lVar7 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&pools);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::WritePools(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);

  const char* jobpools =
    this->GetCMakeInstance()->GetState()->GetGlobalProperty("JOB_POOLS");
  if (jobpools) {
    cmGlobalNinjaGenerator::WriteComment(
      os, "Pools defined by global property JOB_POOLS");
    std::vector<std::string> pools;
    cmSystemTools::ExpandListArgument(jobpools, pools);
    for (size_t i = 0; i < pools.size(); ++i) {
      std::string const& pool = pools[i];
      const std::string::size_type eq = pool.find('=');
      unsigned int jobs;
      if (eq != std::string::npos &&
          sscanf(pool.c_str() + eq, "=%u", &jobs) == 1) {
        os << "pool " << pool.substr(0, eq) << std::endl;
        os << "  depth = " << jobs << std::endl;
        os << std::endl;
      } else {
        cmSystemTools::Error("Invalid pool defined by property 'JOB_POOLS': ",
                             pool.c_str());
      }
    }
  }
}